

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O2

nh_objitem * make_invlist(char *lets,int *icount)

{
  char cVar1;
  bool bVar2;
  char cVar3;
  char *pcVar4;
  char *pcVar5;
  int idx;
  int idx_00;
  obj **obj;
  int nr_items;
  nh_objitem *items;
  int *local_38;
  
  nr_items = 10;
  local_38 = icount;
  items = (nh_objitem *)malloc(0xb68);
  idx = 0;
  pcVar5 = flags.inv_order;
LAB_001a999a:
  pcVar4 = pcVar5;
  obj = &invent;
  bVar2 = false;
  cVar3 = flags.sortpack;
LAB_001a99b6:
  do {
    obj = &((obj *)obj)->nobj->nobj;
    if ((obj *)obj == (obj *)0x0) break;
    cVar1 = ((obj *)obj)->invlet;
    if (((lets == (char *)0x0) || (*lets == '\0')) ||
       (pcVar5 = strchr(lets,(int)cVar1), pcVar5 != (char *)0x0)) {
      idx_00 = idx;
      if (cVar3 != '\0') {
        if (((obj *)obj)->oclass != *pcVar4) goto LAB_001a99b6;
        if (!bVar2) {
          idx_00 = idx + 1;
          pcVar5 = let_to_name(((obj *)obj)->oclass,'\0');
          add_objitem(&items,&nr_items,MI_HEADING,idx,0,pcVar5,(obj *)obj,'\0');
          bVar2 = true;
        }
      }
      examine_object((obj *)obj);
      idx = idx_00 + 1;
      pcVar5 = doname((obj *)obj);
      add_objitem(&items,&nr_items,MI_NORMAL,idx_00,(int)cVar1,pcVar5,(obj *)obj,'\x01');
      cVar3 = flags.sortpack;
    }
  } while( true );
  if ((flags.sortpack == '\0') ||
     ((pcVar5 = pcVar4 + 1, pcVar4[1] == '\0' && (pcVar5 = "\x11", pcVar4 == "\x11")))) {
    *local_38 = idx;
    return items;
  }
  goto LAB_001a999a;
}

Assistant:

static struct nh_objitem *make_invlist(const char *lets, int *icount)
{
	struct obj *otmp;
	char ilet;
	int nr_items = 10, cur_entry = 0, classcount;
	const char *invlet = flags.inv_order;
	struct nh_objitem *items = malloc(nr_items * sizeof(struct nh_objitem));

nextclass:
	classcount = 0;
	for (otmp = invent; otmp; otmp = otmp->nobj) {
	    ilet = otmp->invlet;
	    if (!lets || !*lets || strchr(lets, ilet)) {
		if (!flags.sortpack || otmp->oclass == *invlet) {
		    if (flags.sortpack && !classcount) {
			add_objitem(&items, &nr_items, MI_HEADING, cur_entry++, 0,
				    let_to_name(*invlet, FALSE), otmp, FALSE);
			classcount++;
		    }
		    examine_object(otmp);
		    add_objitem(&items, &nr_items, MI_NORMAL, cur_entry++, ilet,
				doname(otmp), otmp, TRUE);
		}
	    }
	}
	if (flags.sortpack) {
		if (*++invlet)
			goto nextclass;
		if (--invlet != venom_inv) {
			invlet = venom_inv;
			goto nextclass;
		}
	}

	*icount = cur_entry;
	return items;
}